

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O0

SyntaxKind slang::syntax::SyntaxFacts::getKeywordNameExpression(TokenKind kind)

{
  undefined4 local_c;
  TokenKind kind_local;
  
  if (kind == AndKeyword) {
    local_c = ArrayAndMethod;
  }
  else if (kind == LocalKeyword) {
    local_c = LocalScope;
  }
  else if (kind == NewKeyword) {
    local_c = ConstructorName;
  }
  else if (kind == OrKeyword) {
    local_c = ArrayOrMethod;
  }
  else if (kind == SuperKeyword) {
    local_c = SuperHandle;
  }
  else if (kind == ThisKeyword) {
    local_c = ThisHandle;
  }
  else if (kind == UniqueKeyword) {
    local_c = ArrayUniqueMethod;
  }
  else if (kind == XorKeyword) {
    local_c = ArrayXorMethod;
  }
  else if (kind == UnitSystemName) {
    local_c = UnitScope;
  }
  else if (kind == RootSystemName) {
    local_c = RootScope;
  }
  else {
    local_c = Unknown;
  }
  return local_c;
}

Assistant:

SyntaxKind SyntaxFacts::getKeywordNameExpression(TokenKind kind) {
    switch (kind) {
        case TokenKind::UnitSystemName: return SyntaxKind::UnitScope;
        case TokenKind::RootSystemName: return SyntaxKind::RootScope;
        case TokenKind::LocalKeyword: return SyntaxKind::LocalScope;
        case TokenKind::ThisKeyword: return SyntaxKind::ThisHandle;
        case TokenKind::SuperKeyword: return SyntaxKind::SuperHandle;
        case TokenKind::UniqueKeyword: return SyntaxKind::ArrayUniqueMethod;
        case TokenKind::AndKeyword: return SyntaxKind::ArrayAndMethod;
        case TokenKind::OrKeyword: return SyntaxKind::ArrayOrMethod;
        case TokenKind::XorKeyword: return SyntaxKind::ArrayXorMethod;
        case TokenKind::NewKeyword: return SyntaxKind::ConstructorName;
        default: return SyntaxKind::Unknown;
    }
}